

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

char * mpack_node_data(mpack_node_t node)

{
  mpack_type_t mVar1;
  mpack_error_t mVar2;
  mpack_type_t type;
  mpack_node_t node_local;
  
  mVar2 = mpack_node_error(node);
  if (mVar2 == mpack_ok) {
    mVar1 = (node.data)->type;
    if (((mVar1 == mpack_type_str) || (mVar1 == mpack_type_bin)) || (mVar1 == mpack_type_ext)) {
      node_local.tree = (mpack_tree_t *)mpack_node_data_unchecked(node);
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (char *)node_local.tree;
}

Assistant:

MPACK_INLINE const char* mpack_node_data(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    mpack_type_t type = node.data->type;
    if (type == mpack_type_str || type == mpack_type_bin || type == mpack_type_ext)
        return mpack_node_data_unchecked(node);

    mpack_node_flag_error(node, mpack_error_type);
    return NULL;
}